

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::GetDeferredDeltaCommon
          (SscReaderGeneric *this,VariableBase *variable,void *data)

{
  pointer pBVar1;
  pointer puVar2;
  pointer puVar3;
  allocator local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  Dims vMemCount;
  Dims vMemStart;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vStart,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vCount,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vShape,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vMemStart,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0xa0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vMemCount,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0xb8));
  if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (vCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (vShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (vMemStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vMemStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (vMemCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vMemCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  std::
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  ::emplace_back<>(&this->m_LocalReadPattern);
  pBVar1 = (this->m_LocalReadPattern).
           super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)(pBVar1 + -1));
  pBVar1[-1].type = *(DataType *)(variable + 0x28);
  pBVar1[-1].elementSize = *(size_t *)(variable + 0x30);
  pBVar1[-1].shapeId = *(ShapeID *)(variable + 0x40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pBVar1[-1].start,&vStart);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pBVar1[-1].count,&vCount);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pBVar1[-1].shape,&vShape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pBVar1[-1].memStart,&vMemStart);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pBVar1[-1].memCount,&vMemCount);
  pBVar1[-1].bufferStart = 0;
  pBVar1[-1].bufferCount = 0;
  pBVar1[-1].data = data;
  pBVar1[-1].performed = false;
  puVar2 = pBVar1[-1].count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = pBVar1[-1].count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    if (*puVar3 == 0) {
      std::__cxx11::string::string((string *)&local_50,"Engine",&local_129);
      std::__cxx11::string::string((string *)&local_70,"SscReader",&local_12a);
      std::__cxx11::string::string((string *)&local_90,"GetDeferredDeltaCommon",&local_12b);
      std::__cxx11::string::string
                ((string *)&local_b0,"SetSelection count dimensions cannot be 0",&local_12c);
      helper::Throw<std::invalid_argument>(&local_50,&local_70,&local_90,&local_b0,-1);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vMemCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vMemStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void SscReaderGeneric::GetDeferredDeltaCommon(VariableBase &variable, void *data)
{

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;
    Dims vMemStart = variable.m_MemoryStart;
    Dims vMemCount = variable.m_MemoryCount;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    m_LocalReadPattern.emplace_back();
    auto &b = m_LocalReadPattern.back();
    b.name = variable.m_Name;
    b.type = variable.m_Type;
    b.elementSize = variable.m_ElementSize;
    b.shapeId = variable.m_ShapeID;
    b.start = vStart;
    b.count = vCount;
    b.shape = vShape;
    b.memStart = vMemStart;
    b.memCount = vMemCount;
    b.bufferStart = 0;
    b.bufferCount = 0;
    b.data = data;
    b.performed = false;

    for (const auto &d : b.count)
    {
        if (d == 0)
        {
            helper::Throw<std::invalid_argument>("Engine", "SscReader", "GetDeferredDeltaCommon",
                                                 "SetSelection count dimensions cannot be 0");
        }
    }
}